

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  undefined8 *puVar1;
  stbi__uint32 b_00;
  stbi__context *s;
  byte bVar2;
  uint uVar3;
  stbi__uint32 sVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  stbi_uc *psVar9;
  byte *pbVar10;
  void *pvVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int *piVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  
  s = z->s;
  uVar3 = stbi__get16be(s);
  if (uVar3 < 0xb) {
LAB_0013065a:
    pcVar8 = "bad SOF len";
  }
  else {
    psVar9 = s->img_buffer;
    if (psVar9 < s->img_buffer_end) {
LAB_0013068f:
      s->img_buffer = psVar9 + 1;
      if (*psVar9 == '\b') {
        sVar4 = stbi__get16be(s);
        s->img_y = sVar4;
        if (sVar4 == 0) {
          pcVar8 = "no header height";
          goto LAB_001306ea;
        }
        sVar4 = stbi__get16be(s);
        s->img_x = sVar4;
        if (sVar4 == 0) {
          pcVar8 = "0 width";
          goto LAB_001306ea;
        }
        if (0x1000000 < s->img_y) {
          pcVar8 = "too large";
          goto LAB_001306ea;
        }
        pbVar10 = s->img_buffer;
        if (pbVar10 < s->img_buffer_end) {
LAB_00130732:
          s->img_buffer = pbVar10 + 1;
          bVar2 = *pbVar10;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar10 = s->img_buffer;
            goto LAB_00130732;
          }
          bVar2 = 0;
        }
        if ((4 < bVar2) || ((0x1aU >> (bVar2 & 0x1f) & 1) == 0)) {
          pcVar8 = "bad component count";
          goto LAB_001306ea;
        }
        s->img_n = (uint)bVar2;
        if (bVar2 != 0) {
          lVar13 = 0;
          do {
            *(undefined8 *)((long)&z->img_comp[0].data + lVar13) = 0;
            *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar13) = 0;
            lVar13 = lVar13 + 0x60;
          } while ((ulong)bVar2 * 0x60 != lVar13);
        }
        if (uVar3 == (uint)bVar2 + (uint)bVar2 * 2 + 8) {
          z->rgb = 0;
          uVar19 = (ulong)(uint)s->img_n;
          if (0 < s->img_n) {
            piVar15 = &z->img_comp[0].tq;
            lVar13 = 0;
            do {
              pbVar10 = s->img_buffer;
              if (pbVar10 < s->img_buffer_end) {
LAB_001307e0:
                s->img_buffer = pbVar10 + 1;
                bVar2 = *pbVar10;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  pbVar10 = s->img_buffer;
                  goto LAB_001307e0;
                }
                bVar2 = 0;
              }
              ((anon_struct_96_18_0d0905d3 *)(piVar15 + -3))->id = (uint)bVar2;
              if ((s->img_n == 3) && (bVar2 == "RGB"[lVar13])) {
                z->rgb = z->rgb + 1;
              }
              pbVar10 = s->img_buffer;
              if (pbVar10 < s->img_buffer_end) {
LAB_0013083a:
                s->img_buffer = pbVar10 + 1;
                bVar2 = *pbVar10;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  pbVar10 = s->img_buffer;
                  goto LAB_0013083a;
                }
                bVar2 = 0;
              }
              piVar15[-2] = (uint)(bVar2 >> 4);
              if ((byte)(bVar2 + 0xb0) < 0xc0) goto LAB_00130b81;
              piVar15[-1] = bVar2 & 0xf;
              if ((bVar2 & 0xf) - 5 < 0xfffffffc) goto LAB_00130b8d;
              pbVar10 = s->img_buffer;
              if (pbVar10 < s->img_buffer_end) {
LAB_0013089a:
                s->img_buffer = pbVar10 + 1;
                bVar2 = *pbVar10;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  pbVar10 = s->img_buffer;
                  goto LAB_0013089a;
                }
                bVar2 = 0;
              }
              *piVar15 = (uint)bVar2;
              if (3 < bVar2) {
                pcVar8 = "bad TQ";
                goto LAB_001306ea;
              }
              lVar13 = lVar13 + 1;
              uVar19 = (ulong)s->img_n;
              piVar15 = piVar15 + 0x18;
            } while (lVar13 < (long)uVar19);
          }
          if (scan != 0) {
            return 1;
          }
          sVar4 = s->img_x;
          b_00 = s->img_y;
          iVar7 = (int)uVar19;
          iVar5 = stbi__mad3sizes_valid(sVar4,b_00,iVar7,0);
          if (iVar5 == 0) {
            *(char **)(in_FS_OFFSET + -0x20) = "too large";
            return 0;
          }
          if (iVar7 < 1) {
            uVar17 = 1;
            uVar12 = 1;
          }
          else {
            uVar12 = 1;
            lVar13 = 0;
            uVar17 = 1;
            do {
              uVar3 = *(uint *)((long)&z->img_comp[0].h + lVar13);
              uVar6 = *(uint *)((long)&z->img_comp[0].v + lVar13);
              if ((int)uVar17 < (int)uVar3) {
                uVar17 = (ulong)uVar3;
              }
              if ((int)uVar12 < (int)uVar6) {
                uVar12 = (ulong)uVar6;
              }
              lVar13 = lVar13 + 0x60;
            } while ((uVar19 & 0xffffffff) * 0x60 != lVar13);
          }
          iVar16 = (int)uVar17;
          iVar5 = (int)uVar12;
          if (0 < iVar7) {
            lVar13 = 0;
            do {
              if (iVar16 % *(int *)((long)&z->img_comp[0].h + lVar13) != 0) goto LAB_00130b81;
              if (iVar5 % *(int *)((long)&z->img_comp[0].v + lVar13) != 0) goto LAB_00130b8d;
              lVar13 = lVar13 + 0x60;
            } while ((uVar19 & 0xffffffff) * 0x60 != lVar13);
          }
          z->img_h_max = iVar16;
          z->img_v_max = iVar5;
          z->img_mcu_w = iVar16 * 8;
          z->img_mcu_h = iVar5 * 8;
          uVar3 = ((sVar4 + iVar16 * 8) - 1) / (uint)(iVar16 * 8);
          z->img_mcu_x = uVar3;
          uVar6 = ((b_00 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
          z->img_mcu_y = uVar6;
          if (iVar7 < 1) {
            return 1;
          }
          iVar7 = 1;
          lVar13 = 0;
          while( true ) {
            iVar14 = *(int *)((long)&z->img_comp[0].h + lVar13);
            iVar18 = *(int *)((long)&z->img_comp[0].v + lVar13);
            *(int *)((long)&z->img_comp[0].x + lVar13) =
                 (int)((iVar14 * sVar4 + iVar16 + -1) / uVar17);
            *(int *)((long)&z->img_comp[0].y + lVar13) =
                 (int)((iVar18 * b_00 + iVar5 + -1) / uVar12);
            iVar14 = iVar14 * uVar3;
            a = iVar14 * 8;
            *(int *)((long)&z->img_comp[0].w2 + lVar13) = a;
            iVar18 = iVar18 * uVar6;
            b = iVar18 * 8;
            *(int *)((long)&z->img_comp[0].h2 + lVar13) = b;
            pvVar11 = stbi__malloc_mad2(a,b,0xf);
            puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar13);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined8 *)((long)&z->img_comp[0].coeff + lVar13) = 0;
            *(void **)((long)&z->img_comp[0].raw_data + lVar13) = pvVar11;
            why = extraout_EDX;
            if (pvVar11 == (void *)0x0) break;
            *(ulong *)((long)&z->img_comp[0].data + lVar13) =
                 (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
            if (z->progressive != 0) {
              *(int *)((long)&z->img_comp[0].coeff_w + lVar13) = iVar14;
              *(int *)((long)&z->img_comp[0].coeff_h + lVar13) = iVar18;
              pvVar11 = stbi__malloc_mad3(a,b,2,0xf);
              *(void **)((long)&z->img_comp[0].raw_coeff + lVar13) = pvVar11;
              why = extraout_EDX_00;
              if (pvVar11 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].coeff + lVar13) =
                   (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
            }
            iVar7 = iVar7 + 1;
            lVar13 = lVar13 + 0x60;
            if ((uVar19 & 0xffffffff) * 0x60 == lVar13) {
              return 1;
            }
          }
          *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
          stbi__free_jpeg_components(z,iVar7,why);
          return 0;
        }
        goto LAB_0013065a;
      }
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar9 = s->img_buffer;
      goto LAB_0013068f;
    }
    pcVar8 = "only 8-bit";
  }
  goto LAB_001306ea;
LAB_00130b81:
  pcVar8 = "bad H";
  goto LAB_001306ea;
LAB_00130b8d:
  pcVar8 = "bad V";
LAB_001306ea:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar8;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}